

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigStop(Ivy_FraigMan_t *p)

{
  Ivy_FraigMan_t *p_local;
  
  if (p->pParams->fVerbose != 0) {
    Ivy_FraigPrint(p);
  }
  if (p->vPiVars != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vPiVars);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pPatScores != (int *)0x0) {
    free(p->pPatScores);
    p->pPatScores = (int *)0x0;
  }
  if (p->pPatWords != (uint *)0x0) {
    free(p->pPatWords);
    p->pPatWords = (uint *)0x0;
  }
  if (p->pSimWords != (char *)0x0) {
    free(p->pSimWords);
    p->pSimWords = (char *)0x0;
  }
  if (p != (Ivy_FraigMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ivy_FraigStop( Ivy_FraigMan_t * p )
{
    if ( p->pParams->fVerbose )
        Ivy_FraigPrint( p );
    if ( p->vPiVars ) Vec_PtrFree( p->vPiVars );
    if ( p->pSat ) sat_solver_delete( p->pSat );
    ABC_FREE( p->pPatScores );
    ABC_FREE( p->pPatWords );
    ABC_FREE( p->pSimWords );
    ABC_FREE( p );
}